

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hpp
# Opt level: O2

void cppurses::System::post_event<cppurses::Timer_event,cppurses::Widget&>(Widget *args)

{
  pointer *__ptr;
  _Head_base<0UL,_cppurses::Event_*,_false> local_18;
  Event *local_10;
  
  std::make_unique<cppurses::Timer_event,cppurses::Widget&>((Widget *)&stack0xfffffffffffffff0);
  local_18._M_head_impl = local_10;
  local_10 = (Event *)0x0;
  post_event((unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> *)&local_18);
  if (local_18._M_head_impl != (Event *)0x0) {
    (*(local_18._M_head_impl)->_vptr_Event[1])();
  }
  local_18._M_head_impl = (Event *)0x0;
  if (local_10 != (Event *)0x0) {
    (**(code **)(*(_func_int **)local_10 + 8))();
  }
  return;
}

Assistant:

static void post_event(Args&&... args)
    {
        auto event = std::make_unique<T>(std::forward<Args>(args)...);
        System::post_event(std::move(event));
    }